

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O1

void __thiscall
ConfidentialTransactionContext_AddTxInOut_Test::TestBody
          (ConfidentialTransactionContext_AddTxInOut_Test *this)

{
  pointer *ppuVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  char *in_R9;
  Amount AVar5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_2;
  uint32_t index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  ConfidentialAssetId asset;
  OutPoint outpoint;
  Address out1_addr;
  ConfidentialTransactionContext txc;
  Address addr;
  ElementsConfidentialAddress ct_addr;
  undefined1 local_660 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_658;
  undefined1 local_650 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_648;
  undefined *local_640 [3];
  AssertHelper local_628;
  uint32_t local_61c;
  undefined1 local_618 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  Script local_5f0;
  AssertHelper local_5b8;
  OutPoint local_5b0;
  undefined1 local_588 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  uchar local_568 [16];
  pointer local_558;
  pointer local_540;
  pointer local_528;
  TapBranch local_510;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_498;
  Script local_480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_440;
  ConfidentialTransactionContext local_410;
  undefined1 local_358 [32];
  undefined1 local_338 [16];
  pointer local_328;
  pointer local_310;
  pointer local_2f8;
  TapBranch local_2e0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_268;
  Script local_250;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  ElementsConfidentialAddress local_1e0;
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_410,2,0);
  local_358._0_8_ = local_358 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_1e0,(string *)local_358);
  if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
    operator_delete((void *)local_358._0_8_);
  }
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress((Address *)local_358,&local_1e0);
  ppuVar1 = (pointer *)
            ((long)&local_5f0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_5f0._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f0,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_588,(string *)&local_5f0);
  cfd::core::OutPoint::OutPoint(&local_5b0,(Txid *)local_588,2);
  local_588._0_8_ = &PTR__Txid_00735400;
  if ((pointer)local_588._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_588._8_8_);
  }
  if (local_5f0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_5f0._vptr_Script);
  }
  local_650 = (undefined1  [8])local_640;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_650,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)&local_5f0,(string *)local_650);
  cfd::core::OutPoint::OutPoint((OutPoint *)local_588,(Txid *)&local_5f0,0);
  cfd::ConfidentialTransactionContext::AddTxIn(&local_410,(OutPoint *)local_588);
  local_588._0_8_ = &PTR__Txid_00735400;
  if ((pointer)local_588._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_588._8_8_);
  }
  local_5f0._vptr_Script = (_func_int **)&PTR__Txid_00735400;
  if (local_5f0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_650 != (undefined1  [8])local_640) {
    operator_delete((void *)local_650);
  }
  cfd::ConfidentialTransactionContext::AddTxIn(&local_410,&local_5b0);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_650 = (undefined1  [8])AVar5.amount_;
  local_648.ptr_._0_1_ = AVar5.ignore_check_;
  local_5f0._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_588,(string *)&local_5f0);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            (&local_410.super_ConfidentialTransaction,(Amount *)local_650,
             (ConfidentialAssetId *)local_588);
  local_588._0_8_ = &PTR__ConfidentialAssetId_00735710;
  if ((pointer)local_588._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_588._8_8_);
  }
  if (local_5f0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_5f0._vptr_Script);
  }
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_650 = (undefined1  [8])AVar5.amount_;
  local_648.ptr_._0_1_ = AVar5.ignore_check_;
  local_5f0._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_588,(string *)&local_5f0);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_410,&local_1e0,(Amount *)local_650,(ConfidentialAssetId *)local_588,false);
  local_588._0_8_ = &PTR__ConfidentialAssetId_00735710;
  if ((pointer)local_588._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_588._8_8_);
  }
  if (local_5f0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_5f0._vptr_Script);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_588,(AbstractTransaction *)&local_410);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_5f0,"txc.GetHex().c_str()",
             "\"020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000\""
             ,(char *)local_588._0_8_,
             "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._0_8_ != &local_578) {
    operator_delete((void *)local_588._0_8_);
  }
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_588);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x61,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_650,(Message *)local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_588._0_8_ + 8))();
      }
      local_588._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_588,(Address *)local_358);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_5f0,"addr.GetAddress().c_str()",
             "\"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz\"",(char *)local_588._0_8_,
             "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._0_8_ != &local_578) {
    operator_delete((void *)local_588._0_8_);
  }
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_588);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x62,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_650,(Message *)local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_588._0_8_ + 8))();
      }
      local_588._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::ConfidentialTransactionContext::GetTxOutAddress
            ((Address *)local_588,&local_410,1,kElementsRegtest,false);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_5f0,(Address *)local_588);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_650,"out1_addr.GetAddress().c_str()",
             "\"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz\"",(char *)local_5f0._vptr_Script,
             "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");
  if (local_5f0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_5f0._vptr_Script);
  }
  if (local_650[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_5f0);
    if (local_648.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_648.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x65,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_618,(Message *)&local_5f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_618);
    if (local_5f0._vptr_Script != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_5f0._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_5f0._vptr_Script + 8))();
      }
      local_5f0._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_61c = 0;
  bVar2 = cfd::ConfidentialTransactionContext::IsFindTxIn(&local_410,&local_5b0,&local_61c);
  local_650[0] = (string)bVar2;
  local_648.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)local_618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_5f0,(internal *)local_650,
               (AssertionResult *)"txc.IsFindTxIn(outpoint, &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x68,(char *)local_5f0._vptr_Script);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_5f0._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_5f0._vptr_Script);
    }
    if (local_618 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_618 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_618 + 8))();
      }
      local_618 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_650._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_5f0,"index","1",&local_61c,(int *)local_650);
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_650);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x69,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_618,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_618);
    if (local_650 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_650 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_650 + 8))();
      }
      local_650 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::ConfidentialTransactionContext::IsFindTxOut
                    (&local_410,(Address *)local_358,&local_61c,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  local_650[0] = (string)bVar2;
  local_648.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)local_618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_5f0,(internal *)local_650,
               (AssertionResult *)"txc.IsFindTxOut(addr, &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6a,(char *)local_5f0._vptr_Script);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_5f0._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_5f0._vptr_Script);
    }
    if (local_618 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_618 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_618 + 8))();
      }
      local_618 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_650._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_5f0,"index","1",&local_61c,(int *)local_650);
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_650);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_618,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_618);
    if (local_650 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_650 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_650 + 8))();
      }
      local_650 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script(&local_5f0);
  bVar2 = cfd::ConfidentialTransactionContext::IsFindTxOut
                    (&local_410,&local_5f0,&local_61c,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  local_650[0] = (string)bVar2;
  local_648.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cfd::core::Script::~Script(&local_5f0);
  if (local_650[0] == (string)0x0) {
    testing::Message::Message((Message *)local_618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_5f0,(internal *)local_650,
               (AssertionResult *)"txc.IsFindTxOut(Script(), &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6c,(char *)local_5f0._vptr_Script);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_5f0._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_5f0._vptr_Script);
    }
    if (local_618 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_618 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_618 + 8))();
      }
      local_618 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_650 = (undefined1  [8])((ulong)local_650 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_5f0,"index","0",&local_61c,(int *)local_650);
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_650);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_618,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_618);
    if (local_650 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_650 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_650 + 8))();
      }
      local_650 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = cfd::ConfidentialTransactionContext::GetTxOutIndex(&local_410,(Address *)local_358);
  local_650._0_4_ = uVar3;
  local_618._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_5f0,"txc.GetTxOutIndex(addr)","1",(uint *)local_650,(int *)local_618
            );
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_650);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_618,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_618);
    if (local_650 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_650 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_650 + 8))();
      }
      local_650 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = cfd::ConfidentialTransactionContext::IsFindFeeTxOut(&local_410,&local_61c);
  local_650[0] = (string)bVar2;
  local_648.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)local_618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_5f0,(internal *)local_650,
               (AssertionResult *)"txc.IsFindFeeTxOut(&index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6f,(char *)local_5f0._vptr_Script);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_5f0._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_5f0._vptr_Script);
    }
    if (local_618 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_618 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_618 + 8))();
      }
      local_618 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_650 = (undefined1  [8])((ulong)local_650 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_5f0,"index","0",&local_61c,(int *)local_650);
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_650);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x70,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_618,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_618);
    if (local_650 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_650 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_650 + 8))();
      }
      local_650 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&local_5f0);
  AVar5 = cfd::ConfidentialTransactionContext::GetFeeAmount
                    (&local_410,(ConfidentialAssetId *)&local_5f0);
  local_618 = (undefined1  [8])AVar5.amount_;
  sStack_610.ptr_._0_1_ = AVar5.ignore_check_;
  local_660 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue((Amount *)local_618);
  local_628.data_._0_4_ = 0x1c84;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_650,"txc.GetFeeAmount(&asset).GetSatoshiValue()","7300",
             (long *)local_660,(int *)&local_628);
  if (local_650[0] == (string)0x0) {
    testing::Message::Message((Message *)local_618);
    if (local_648.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_648.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x72,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_618 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_618 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_618 + 8))();
      }
      local_618 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_650,(ConfidentialAssetId *)&local_5f0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_618,"asset.GetHex().c_str()",
             "\"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225\"",
             (char *)local_650,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  if (local_650 != (undefined1  [8])local_640) {
    operator_delete((void *)local_650);
  }
  if (local_618[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_650);
    if (sStack_610.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((sStack_610.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x73,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_650 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_650 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_650 + 8))();
      }
      local_650 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_610,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_660 = (undefined1  [8])AVar5.amount_;
  local_658.ptr_._0_1_ = AVar5.ignore_check_;
  local_618 = (undefined1  [8])&local_608;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_618,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_650,(string *)local_618);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_410,&local_1e0,(Amount *)local_660,(ConfidentialAssetId *)local_650,false);
  local_650 = (undefined1  [8])&PTR__ConfidentialAssetId_00735710;
  if (local_648.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_648.ptr_);
  }
  if (local_618 != (undefined1  [8])&local_608) {
    operator_delete((void *)local_618);
  }
  local_618 = (undefined1  [8])0x0;
  sStack_610.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_608._M_allocated_capacity = 0;
  bVar2 = cfd::ConfidentialTransactionContext::IsFindTxOut
                    (&local_410,(Address *)local_358,&local_61c,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_618);
  local_660[0] = bVar2;
  local_658.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_628);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_650,(internal *)local_660,
               (AssertionResult *)"txc.IsFindTxOut(addr, &index, &indexes)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7a,(char *)local_650);
    testing::internal::AssertHelper::operator=(&local_5b8,(Message *)&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_5b8);
    if (local_650 != (undefined1  [8])local_640) {
      operator_delete((void *)local_650);
    }
    if (local_628.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_628.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_628.data_ + 8))();
      }
      local_628.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_658,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_660._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_650,"index","1",&local_61c,(int *)local_660);
  if (local_650[0] == (string)0x0) {
    testing::Message::Message((Message *)local_660);
    if (local_648.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_648.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_628,(Message *)local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    if (local_660 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_660 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_660 + 8))();
      }
      local_660 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_660 = (undefined1  [8])((long)sStack_610.ptr_ - (long)local_618 >> 2);
  local_628.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_650,"indexes.size()","2",(unsigned_long *)local_660,(int *)&local_628
            );
  if (local_650[0] == (string)0x0) {
    testing::Message::Message((Message *)local_660);
    if (local_648.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_648.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_628,(Message *)local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    if (local_660 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_660 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_660 + 8))();
      }
      local_660 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long)sStack_610.ptr_ - (long)local_618 == 8) {
    local_660._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)local_650,"indexes[0]","1",(uint *)local_618,(int *)local_660);
    if (local_650[0] == (string)0x0) {
      testing::Message::Message((Message *)local_660);
      if (local_648.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_648.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_628,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x7e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_628,(Message *)local_660);
      testing::internal::AssertHelper::~AssertHelper(&local_628);
      if (local_660 != (undefined1  [8])0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_660 != (undefined1  [8])0x0)) {
          (**(code **)(*(long *)local_660 + 8))();
        }
        local_660 = (undefined1  [8])0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_660._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)local_650,"indexes[1]","2",(uint *)((long)local_618 + 4),(int *)local_660
              );
    if (local_650[0] == (string)0x0) {
      testing::Message::Message((Message *)local_660);
      if (local_648.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_648.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_628,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x7f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_628,(Message *)local_660);
      testing::internal::AssertHelper::~AssertHelper(&local_628);
      if (local_660 != (undefined1  [8])0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_660 != (undefined1  [8])0x0)) {
          (**(code **)(*(long *)local_660 + 8))();
        }
        local_660 = (undefined1  [8])0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_648,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (local_618 != (undefined1  [8])0x0) {
    operator_delete((void *)local_618);
  }
  local_5f0._vptr_Script = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (local_5f0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_440);
  cfd::core::Script::~Script(&local_480);
  local_510._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_498);
  cfd::core::TapBranch::~TapBranch(&local_510);
  if (local_528 != (pointer)0x0) {
    operator_delete(local_528);
  }
  if (local_540 != (pointer)0x0) {
    operator_delete(local_540);
  }
  if (local_558 != (pointer)0x0) {
    operator_delete(local_558);
  }
  if ((uchar *)local_578._M_allocated_capacity != local_568) {
    operator_delete((void *)local_578._M_allocated_capacity);
  }
  local_5b0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_5b0.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5b0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_210);
  cfd::core::Script::~Script(&local_250);
  local_2e0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_268);
  cfd::core::TapBranch::~TapBranch(&local_2e0);
  if (local_2f8 != (pointer)0x0) {
    operator_delete(local_2f8);
  }
  if (local_310 != (pointer)0x0) {
    operator_delete(local_310);
  }
  if (local_328 != (pointer)0x0) {
    operator_delete(local_328);
  }
  if ((undefined1 *)local_358._16_8_ != local_338) {
    operator_delete((void *)local_358._16_8_);
  }
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_1e0);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_410);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddTxInOut)
{
  ConfidentialTransactionContext txc(2, 0);
  ElementsConfidentialAddress ct_addr("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
  Address addr = ct_addr.GetUnblindedAddress();
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  txc.AddTxIn(OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0));
  txc.AddTxIn(outpoint);
  txc.AddTxOutFee(
      Amount::CreateBySatoshiAmount(7300),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

  EXPECT_STREQ(txc.GetHex().c_str(), "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");
  EXPECT_STREQ(addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  Address out1_addr = txc.GetTxOutAddress(1, NetType::kElementsRegtest);
  EXPECT_STREQ(out1_addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  uint32_t index = 0;
  EXPECT_TRUE(txc.IsFindTxIn(outpoint, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(Script(), &index));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(txc.GetTxOutIndex(addr), 1);
  EXPECT_TRUE(txc.IsFindFeeTxOut(&index));
  EXPECT_EQ(index, 0);
  ConfidentialAssetId asset;
  EXPECT_EQ(txc.GetFeeAmount(&asset).GetSatoshiValue(), 7300);
  EXPECT_STREQ(asset.GetHex().c_str(), "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  std::vector<uint32_t> indexes;
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index, &indexes));
  EXPECT_EQ(index, 1);
  EXPECT_EQ(indexes.size(), 2);
  if (indexes.size() == 2) {
    EXPECT_EQ(indexes[0], 1);
    EXPECT_EQ(indexes[1], 2);
  }
}